

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O1

uint * Abc_NodeSuperChoiceTruth(Abc_ManScl_t *pManScl)

{
  void **ppvVar1;
  uint **ppuVar2;
  Vec_Ptr_t *pVVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  long lVar10;
  
  lVar7 = (long)pManScl->vLeaves->nSize;
  if (0 < lVar7) {
    ppvVar1 = pManScl->vLeaves->pArray;
    ppuVar2 = pManScl->uVars;
    lVar9 = 0;
    do {
      *(uint **)((long)ppvVar1[lVar9] + 8) = ppuVar2[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  pVVar3 = pManScl->vVolume;
  if (pVVar3->nSize < 1) {
    puVar8 = (uint *)0x0;
  }
  else {
    ppvVar1 = pVVar3->pArray;
    ppuVar2 = pManScl->uSims;
    lVar7 = 0;
    do {
      plVar4 = (long *)ppvVar1[lVar7];
      puVar8 = ppuVar2[lVar7];
      plVar4[1] = (long)puVar8;
      lVar9 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
      lVar5 = *(long *)(*(long *)(lVar9 + (long)*(int *)plVar4[4] * 8) + 8);
      lVar9 = *(long *)(*(long *)(lVar9 + (long)((int *)plVar4[4])[1] * 8) + 8);
      pcVar6 = (char *)plVar4[7];
      if (*pcVar6 == '0') {
        if (pcVar6[1] == '0') {
          if (0 < pManScl->nWords) {
            lVar10 = 0;
            do {
              puVar8[lVar10] = ~(*(uint *)(lVar9 + lVar10 * 4) | *(uint *)(lVar5 + lVar10 * 4));
              lVar10 = lVar10 + 1;
            } while (lVar10 < pManScl->nWords);
          }
        }
        else if (0 < pManScl->nWords) {
          lVar10 = 0;
          do {
            puVar8[lVar10] = ~*(uint *)(lVar5 + lVar10 * 4) & *(uint *)(lVar9 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pManScl->nWords);
        }
      }
      else if (pcVar6[1] == '0') {
        if (0 < pManScl->nWords) {
          lVar10 = 0;
          do {
            puVar8[lVar10] = ~*(uint *)(lVar9 + lVar10 * 4) & *(uint *)(lVar5 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pManScl->nWords);
        }
      }
      else if (0 < pManScl->nWords) {
        lVar10 = 0;
        do {
          puVar8[lVar10] = *(uint *)(lVar9 + lVar10 * 4) & *(uint *)(lVar5 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pManScl->nWords);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar3->nSize);
  }
  return puVar8;
}

Assistant:

unsigned * Abc_NodeSuperChoiceTruth( Abc_ManScl_t * pManScl )
{
    Abc_Obj_t * pObj;
    unsigned * puData0, * puData1, * puData = NULL;
    char * pSop;
    int i, k;
    // set elementary truth tables
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vLeaves, pObj, i )
        pObj->pNext = (Abc_Obj_t *)pManScl->uVars[i];
    // compute truth tables for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vVolume, pObj, i )
    {
        // set storage for the node's simulation info
        pObj->pNext = (Abc_Obj_t *)pManScl->uSims[i];
        // get pointer to the simulation info
        puData  = (unsigned *)pObj->pNext;
        puData0 = (unsigned *)Abc_ObjFanin0(pObj)->pNext;
        puData1 = (unsigned *)Abc_ObjFanin1(pObj)->pNext;
        // simulate
        pSop = (char *)pObj->pData;
        if ( pSop[0] == '0' && pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & ~puData1[k];
        else if ( pSop[0] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & puData1[k];
        else if ( pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & ~puData1[k];
        else 
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & puData1[k];
    }
    return puData;
}